

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSubsetHB.c
# Opt level: O2

DdNode * Cudd_SupersetHeavyBranch(DdManager *dd,DdNode *f,int numVars,int threshold)

{
  DdNode *pDVar1;
  
  memOut = 0;
  do {
    dd->reordered = 0;
    pDVar1 = cuddSubsetHeavyBranch(dd,(DdNode *)((ulong)f ^ 1),numVars,threshold);
    if (dd->reordered != 1) break;
  } while ((memOut & 1) == 0);
  return (DdNode *)((ulong)(pDVar1 != (DdNode *)0x0) ^ (ulong)pDVar1);
}

Assistant:

DdNode *
Cudd_SupersetHeavyBranch(
  DdManager * dd /* manager */,
  DdNode * f /* function to be superset */,
  int  numVars /* number of variables in the support of f */,
  int  threshold /* maximum number of nodes in the superset */)
{
    DdNode *subset, *g;

    g = Cudd_Not(f);
    memOut = 0;
    do {
        dd->reordered = 0;
        subset = cuddSubsetHeavyBranch(dd, g, numVars, threshold);
    } while ((dd->reordered == 1) && (!memOut));

    return(Cudd_NotCond(subset, (subset != NULL)));

}